

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

size_t __thiscall ON_FixedSizePool::SizeOfPool(ON_FixedSizePool *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = this->m_sizeof_element;
  lVar4 = 0;
  puVar2 = (undefined8 *)this->m_first_block;
  while (puVar2 != (undefined8 *)0x0) {
    if (uVar1 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = ((puVar2[1] - (long)puVar2) - 0x10U) / uVar1;
    }
    lVar4 = lVar4 + uVar3;
    puVar2 = (undefined8 *)*puVar2;
  }
  return uVar1 * lVar4;
}

Assistant:

size_t ON_FixedSizePool::SizeOfPool() const
{
  size_t element_count = 0;
  void* next = m_first_block;
  for (void* blk = next; nullptr != blk; blk = next)
  {
    next = *((void**)blk);
    element_count += BlockElementCapacity(blk);
  }
  return element_count * m_sizeof_element;
}